

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftglyph.c
# Opt level: O1

FT_Error FT_Glyph_Transform(FT_Glyph glyph,FT_Matrix *matrix,FT_Vector *delta)

{
  FT_Glyph_TransformFunc p_Var1;
  FT_Error FVar2;
  
  FVar2 = 6;
  if ((glyph != (FT_Glyph)0x0) && (glyph->clazz != (FT_Glyph_Class *)0x0)) {
    p_Var1 = glyph->clazz->glyph_transform;
    if (p_Var1 == (FT_Glyph_TransformFunc)0x0) {
      FVar2 = 0x12;
    }
    else {
      (*p_Var1)(glyph,matrix,delta);
      FVar2 = 0;
      if (matrix != (FT_Matrix *)0x0) {
        FT_Vector_Transform(&glyph->advance,matrix);
        FVar2 = 0;
      }
    }
  }
  return FVar2;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Glyph_Transform( FT_Glyph          glyph,
                      const FT_Matrix*  matrix,
                      const FT_Vector*  delta )
  {
    FT_Error  error = FT_Err_Ok;


    if ( !glyph || !glyph->clazz )
      error = FT_THROW( Invalid_Argument );
    else
    {
      const FT_Glyph_Class*  clazz = glyph->clazz;


      if ( clazz->glyph_transform )
      {
        /* transform glyph image */
        clazz->glyph_transform( glyph, matrix, delta );

        /* transform advance vector */
        if ( matrix )
          FT_Vector_Transform( &glyph->advance, matrix );
      }
      else
        error = FT_THROW( Invalid_Glyph_Format );
    }
    return error;
  }